

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

UniValue * MempoolInfoToJSON(CTxMemPool *pool)

{
  CFeeRate this;
  UniValue *this_00;
  UniValue *val;
  CTxMemPool *this_01;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *ret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  UniValue *in_stack_fffffffffffff928;
  CTxMemPool *in_stack_fffffffffffff930;
  CTxMemPool *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  UniValue *in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  allocator<char> *amount;
  UniValue *in_stack_fffffffffffff960;
  UniValue *in_stack_fffffffffffff968;
  UniValue *in_stack_fffffffffffff970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  CTxMemPool *in_stack_fffffffffffff988;
  allocator<char> local_5e1;
  size_type local_5e0;
  allocator<char> local_5d3;
  allocator<char> local_5d2;
  allocator<char> local_5d1;
  CAmount local_5d0;
  undefined1 local_5c3 [2];
  allocator<char> local_5c1;
  size_t local_5c0;
  allocator<char> local_5b1 [16];
  allocator<char> local_5a1;
  unsigned_long local_5a0;
  allocator<char> local_593;
  undefined1 local_592;
  allocator<char> local_591 [1417];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff928);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff968,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff960,
             in_stack_fffffffffffff958,in_stack_fffffffffffff950,
             (int)((ulong)in_stack_fffffffffffff948 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff948 >> 0x18,0));
  std::__cxx11::string::string(in_stack_fffffffffffff940);
  UniValue::UniValue(in_stack_fffffffffffff948,(VType)((ulong)in_stack_fffffffffffff940 >> 0x20),
                     (string *)in_stack_fffffffffffff938);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (allocator<char> *)in_stack_fffffffffffff968);
  local_592 = CTxMemPool::GetLoadTried(in_stack_fffffffffffff938);
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff968,(bool *)in_stack_fffffffffffff960);
  UniValue::pushKV(in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (allocator<char> *)in_stack_fffffffffffff968);
  local_5a0 = CTxMemPool::size(in_stack_fffffffffffff938);
  UniValue::UniValue<long,_long,_true>(in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
  UniValue::pushKV(in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_593);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (allocator<char> *)in_stack_fffffffffffff968);
  local_5b1._1_8_ = CTxMemPool::GetTotalTxSize(in_stack_fffffffffffff938);
  UniValue::UniValue<long,_long,_true>(in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
  UniValue::pushKV(in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (allocator<char> *)in_stack_fffffffffffff968);
  local_5c0 = CTxMemPool::DynamicMemoryUsage(in_stack_fffffffffffff988);
  UniValue::UniValue<long,_long,_true>(in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
  UniValue::pushKV(in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (allocator<char> *)in_stack_fffffffffffff968);
  CTxMemPool::GetTotalFee(in_stack_fffffffffffff938);
  ValueFromAmount((CAmount)in_stack_fffffffffffff958);
  UniValue::pushKV(in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
             (allocator<char> *)in_stack_fffffffffffff968);
  UniValue::UniValue<const_long_&,_long,_true>
            (in_stack_fffffffffffff968,(long *)in_stack_fffffffffffff960);
  UniValue::pushKV(in_stack_fffffffffffff970,(string *)in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator((allocator<char> *)(local_5c3 + 1));
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)in_stack_fffffffffffff970,(allocator<char> *)in_stack_fffffffffffff968)
  ;
  this = CTxMemPool::GetMinFee(in_stack_fffffffffffff930);
  local_5d0 = this.nSatoshisPerK;
  this_00 = (UniValue *)
            std::max<CFeeRate>((CFeeRate *)in_stack_fffffffffffff930,
                               (CFeeRate *)in_stack_fffffffffffff928);
  val = (UniValue *)CFeeRate::GetFeePerK((CFeeRate *)in_stack_fffffffffffff928);
  ValueFromAmount((CAmount)in_stack_fffffffffffff958);
  UniValue::pushKV((UniValue *)this.nSatoshisPerK,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator((allocator<char> *)local_5c3);
  amount = &local_5d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this.nSatoshisPerK,(allocator<char> *)this_00);
  this_01 = (CTxMemPool *)CFeeRate::GetFeePerK((CFeeRate *)in_stack_fffffffffffff928);
  ValueFromAmount((CAmount)amount);
  UniValue::pushKV((UniValue *)this.nSatoshisPerK,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this.nSatoshisPerK,(allocator<char> *)this_00);
  CFeeRate::GetFeePerK((CFeeRate *)in_stack_fffffffffffff928);
  ValueFromAmount((CAmount)amount);
  UniValue::pushKV((UniValue *)this.nSatoshisPerK,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_5d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this.nSatoshisPerK,(allocator<char> *)this_00);
  CTxMemPool::GetUnbroadcastTxs(this_01);
  local_5e0 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::size
                        ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                         in_stack_fffffffffffff928);
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this_00,(unsigned_long *)val);
  UniValue::pushKV((UniValue *)this.nSatoshisPerK,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffff928
            );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_5d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this.nSatoshisPerK,(allocator<char> *)this_00);
  UniValue::UniValue<const_bool_&,_bool,_true>(this_00,(bool *)val);
  UniValue::pushKV((UniValue *)this.nSatoshisPerK,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff928);
  std::allocator<char>::~allocator(&local_5e1);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff928);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue MempoolInfoToJSON(const CTxMemPool& pool)
{
    // Make sure this call is atomic in the pool.
    LOCK(pool.cs);
    UniValue ret(UniValue::VOBJ);
    ret.pushKV("loaded", pool.GetLoadTried());
    ret.pushKV("size", (int64_t)pool.size());
    ret.pushKV("bytes", (int64_t)pool.GetTotalTxSize());
    ret.pushKV("usage", (int64_t)pool.DynamicMemoryUsage());
    ret.pushKV("total_fee", ValueFromAmount(pool.GetTotalFee()));
    ret.pushKV("maxmempool", pool.m_opts.max_size_bytes);
    ret.pushKV("mempoolminfee", ValueFromAmount(std::max(pool.GetMinFee(), pool.m_opts.min_relay_feerate).GetFeePerK()));
    ret.pushKV("minrelaytxfee", ValueFromAmount(pool.m_opts.min_relay_feerate.GetFeePerK()));
    ret.pushKV("incrementalrelayfee", ValueFromAmount(pool.m_opts.incremental_relay_feerate.GetFeePerK()));
    ret.pushKV("unbroadcastcount", uint64_t{pool.GetUnbroadcastTxs().size()});
    ret.pushKV("fullrbf", pool.m_opts.full_rbf);
    return ret;
}